

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O3

int envy_bios_parse_conn(envy_bios *bios)

{
  byte bVar1;
  uint8_t uVar2;
  byte bVar3;
  ushort uVar4;
  undefined2 uVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  envy_bios_conn_entry *peVar10;
  byte bVar11;
  sbyte sVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  int *piVar16;
  int iVar17;
  uint uVar18;
  char *__format;
  ulong uVar19;
  int iVar20;
  uint8_t bytes [4];
  undefined8 uStack_38;
  
  uVar4 = (bios->conn).offset;
  iVar20 = 0;
  if (uVar4 != 0) {
    uStack_38 = 0;
    uVar18 = bios->length;
    if (uVar4 < uVar18) {
      (bios->conn).version = bios->data[(uint)uVar4];
      iVar20 = 0;
    }
    else {
      (bios->conn).version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar4 = (bios->conn).offset;
      uVar18 = bios->length;
      iVar20 = -0xe;
    }
    uVar19 = (ulong)uVar4;
    lVar9 = uVar19 + 1;
    if ((uint)lVar9 < uVar18) {
      (bios->conn).hlen = bios->data[lVar9];
      iVar17 = 0;
    }
    else {
      (bios->conn).hlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar9);
      uVar19 = (ulong)(bios->conn).offset;
      uVar18 = bios->length;
      iVar17 = -0xe;
    }
    uVar13 = (uint)uVar19;
    lVar9 = uVar19 + 2;
    if ((uint)lVar9 < uVar18) {
      (bios->conn).entriesnum = bios->data[lVar9];
      iVar7 = 0;
    }
    else {
      (bios->conn).entriesnum = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar9);
      uVar13 = (uint)(bios->conn).offset;
      uVar18 = bios->length;
      iVar7 = -0xe;
    }
    if ((uint)((ulong)uVar13 + 3) < uVar18) {
      (bios->conn).rlen = bios->data[(ulong)uVar13 + 3];
      iVar8 = 0;
    }
    else {
      (bios->conn).rlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar8 = -0xe;
    }
    if (((iVar17 == 0 && iVar20 == 0) && iVar7 == 0) && iVar8 == 0) {
      envy_bios_block(bios,(uint)(bios->conn).offset,
                      (uint)(bios->conn).entriesnum * (uint)(bios->conn).rlen +
                      (uint)(bios->conn).hlen,"CONN",-1);
      bVar1 = (bios->conn).rlen;
      uVar19 = (ulong)bVar1;
      uVar2 = (bios->conn).version;
      if ((uVar2 == '0') || (uVar2 == '@')) {
        bVar11 = (bios->conn).hlen;
        if (bVar11 < 5) {
          __format = "CONN table header too short [%d < %d]\n";
          uVar19 = (ulong)(uint)bVar11;
          uVar14 = 5;
        }
        else {
          uVar18 = (uint)(3 < bVar1) * 2 + 2;
          if (uVar18 < bVar1 || uVar18 == bVar1) {
            if (bVar11 != 5) {
              fprintf(_stderr,"CONN table header longer than expected [%d > %d]\n",
                      (ulong)(uint)bVar11,5);
              uVar19 = (ulong)(bios->conn).rlen;
            }
            if (uVar18 < (uint)uVar19) {
              fprintf(_stderr,"CONN table record longer than expected [%d > %d]\n",uVar19,
                      (ulong)uVar18);
            }
            bVar1 = (bios->conn).entriesnum;
            peVar10 = (envy_bios_conn_entry *)calloc((ulong)bVar1,10);
            (bios->conn).entries = peVar10;
            if (peVar10 == (envy_bios_conn_entry *)0x0) {
              return -0xc;
            }
            if (bVar1 != 0) {
              uVar19 = 0;
              do {
                peVar10 = (bios->conn).entries + uVar19;
                uVar5 = (bios->conn).offset;
                peVar10->offset =
                     (ushort)(bios->conn).rlen * (short)uVar19 + (ushort)(bios->conn).hlen + uVar5;
                uStack_38 = uStack_38 & 0xffffffff;
                peVar10->hpd = -1;
                peVar10->dp_ext = -1;
                bVar1 = (bios->conn).rlen;
                bVar11 = 0;
                uVar14 = 0;
                uVar18 = 0;
                do {
                  if (bVar1 <= uVar14) break;
                  uVar4 = peVar10->offset;
                  if (bios->length <= (uint)uVar4 + (int)uVar14) {
                    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",
                            (ulong)((int)uVar14 + (uint)uVar4));
                    goto LAB_0025b38b;
                  }
                  bVar3 = bios->data[uVar14 + uVar4];
                  *(byte *)((long)&uStack_38 + uVar14 + 4) = bVar3;
                  uVar18 = uVar18 | (uint)bVar3 << (bVar11 & 0x1f);
                  uVar14 = uVar14 + 1;
                  bVar11 = bVar11 + 8;
                } while (uVar14 != 4);
                peVar10->type = '\0';
                peVar10->tag = '\0';
                piVar16 = envy_bios_parse_conn::hpds;
                lVar9 = 0;
                do {
                  if ((uVar18 >> (*piVar16 & 0x1fU) & 1) != 0) {
                    if (peVar10->hpd == -1) {
                      peVar10->hpd = (int8_t)lVar9;
                    }
                    else {
                      fprintf(_stderr,"CONN %d: duplicate HPD bits\n",uVar19 & 0xffffffff);
                    }
                  }
                  lVar9 = lVar9 + 1;
                  piVar16 = (int *)((uint *)piVar16 + 1);
                } while (lVar9 != 7);
                sVar12 = 0;
                bVar6 = true;
                do {
                  bVar15 = bVar6;
                  if (((uVar18 >> sVar12) >> 0xe & 1) != 0) {
                    if (peVar10->dp_ext == -1) {
                      peVar10->dp_ext = sVar12;
                    }
                    else {
                      fprintf(_stderr,"CONN %d: duplicate DP_AUX bits\n",uVar19 & 0xffffffff);
                    }
                  }
                  sVar12 = 1;
                  bVar6 = false;
                } while (bVar15);
                peVar10->unk02_2 = uStack_38._6_1_ >> 2 & 3;
                peVar10->unk02_4 = uStack_38._6_1_ >> 4 & 7;
                peVar10->unk02_7 = uStack_38._6_1_ >> 7;
                peVar10->unk03_3 = uStack_38._7_1_ >> 3;
                uVar19 = uVar19 + 1;
              } while (uVar19 < (bios->conn).entriesnum);
            }
            (bios->conn).valid = '\x01';
            return 0;
          }
          __format = "CONN table record too short [%d < %d]\n";
          uVar14 = (ulong)uVar18;
        }
        fprintf(_stderr,__format,uVar19,uVar14);
      }
      else {
        envy_bios_parse_conn_cold_1();
      }
      iVar20 = -0x16;
    }
    else {
LAB_0025b38b:
      iVar20 = -0xe;
    }
  }
  return iVar20;
}

Assistant:

int envy_bios_parse_conn (struct envy_bios *bios) {
	struct envy_bios_conn *conn = &bios->conn;
	if (!conn->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, conn->offset, &conn->version);
	err |= bios_u8(bios, conn->offset+1, &conn->hlen);
	err |= bios_u8(bios, conn->offset+2, &conn->entriesnum);
	err |= bios_u8(bios, conn->offset+3, &conn->rlen);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, conn->offset, conn->hlen + conn->rlen * conn->entriesnum, "CONN", -1);
	int wanthlen = 5;
	int wantrlen = 4;
	if (conn->rlen < 4)
		wantrlen = 2;
	switch (conn->version) {
		case 0x30:
		case 0x40:
			break;
		default:
			ENVY_BIOS_ERR("Unknown CONN table version %d.%d\n", conn->version >> 4, conn->version & 0xf);
			return -EINVAL;
	}
	if (conn->hlen < wanthlen) {
		ENVY_BIOS_ERR("CONN table header too short [%d < %d]\n", conn->hlen, wanthlen);
		return -EINVAL;
	}
	if (conn->rlen < wantrlen) {
		ENVY_BIOS_ERR("CONN table record too short [%d < %d]\n", conn->rlen, wantrlen);
		return -EINVAL;
	}
	if (conn->hlen > wanthlen) {
		ENVY_BIOS_WARN("CONN table header longer than expected [%d > %d]\n", conn->hlen, wanthlen);
	}
	if (conn->rlen > wantrlen) {
		ENVY_BIOS_WARN("CONN table record longer than expected [%d > %d]\n", conn->rlen, wantrlen);
	}
	conn->entries = calloc(conn->entriesnum, sizeof *conn->entries);
	if (!conn->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < conn->entriesnum; i++) {
		struct envy_bios_conn_entry *entry = &conn->entries[i];
		entry->offset = conn->offset + conn->hlen + conn->rlen * i;
		uint8_t bytes[4] = { 0 };
		uint32_t val = 0;
		int j;
		static const int hpds[7] = { 12, 13, 16, 17, 24, 25, 26 };
		entry->hpd = -1;
		entry->dp_ext = -1;
		for (j = 0; j < 4 && j < conn->rlen; j++) {
			err |= bios_u8(bios, entry->offset+j, &bytes[j]);
			if (err)
				return -EFAULT;
			val |= bytes[j] << j * 8;
		}
		entry->type = bytes[0];
		entry->tag = bytes[1] & 0xf;
		for (j = 0; j < 7; j++) {
			if (val & 1 << hpds[j]) {
				if (entry->hpd == -1)
					entry->hpd = j;
				else
					ENVY_BIOS_ERR("CONN %d: duplicate HPD bits\n", i);
			}
		}
		for (j = 0; j < 2; j++) {
			if (val & 1 << (j+14)) {
				if (entry->dp_ext == -1)
					entry->dp_ext = j;
				else
					ENVY_BIOS_ERR("CONN %d: duplicate DP_AUX bits\n", i);
			}
		}
		entry->unk02_2 = bytes[2] >> 2 & 3;
		entry->unk02_4 = bytes[2] >> 4 & 7;
		entry->unk02_7 = bytes[2] >> 7 & 1;
		entry->unk03_3 = bytes[3] >> 3 & 0x1f;
	}
	conn->valid = 1;
	return 0;
}